

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O3

ssize_t __thiscall
brynet::net::TCPSession::send(TCPSession *this,int __fd,void *__buf,size_t __n,int __flags)

{
  shared_ptr<brynet::net::IOLoopData> *ioLoopData;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000084;
  size_t in_stack_ffffffffffffffd0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffd8;
  
  ioLoopData = (shared_ptr<brynet::net::IOLoopData> *)this->mSocketID;
  DataSocket::makePacket_abi_cxx11_((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  IOLoopDataSend((net *)&this->mIoLoopData,ioLoopData,(SESSION_TYPE)&stack0xffffffffffffffd0,
                 (PACKET_PTR *)__n,(PACKED_SENDED_CALLBACK *)CONCAT44(in_register_00000084,__flags))
  ;
  sVar1 = extraout_RAX;
  if (in_stack_ffffffffffffffd8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffffd8);
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void TCPSession::send(const char* buffer, 
    size_t len, 
    const DataSocket::PACKED_SENDED_CALLBACK& callback) const
{
    IOLoopDataSend(mIoLoopData, mSocketID, DataSocket::makePacket(buffer, len), callback);
}